

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

ConstNodeRef __thiscall c4::yml::Tree::ref(Tree *this,size_t id)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  ConstNodeRef CVar4;
  char msg [53];
  char local_48 [56];
  
  if ((id == 0xffffffffffffffff) || (this->m_size <= id)) {
    builtin_strncpy(local_48,"check failed: (id != NONE && id >= 0 && id < m_size)",0x35);
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        CVar4 = (ConstNodeRef)(*pcVar1)();
        return CVar4;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x625d) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x625d) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_48,0x35,LVar2,(this->m_callbacks).m_user_data);
  }
  CVar4.m_id = id;
  CVar4.m_tree = this;
  return CVar4;
}

Assistant:

ConstNodeRef Tree::ref(size_t id) const
{
    _RYML_CB_ASSERT(m_callbacks, id != NONE && id >= 0 && id < m_size);
    return ConstNodeRef(this, id);
}